

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_ugrid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  uint uVar1;
  int iVar2;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT face_id;
  REF_INT new_qua;
  REF_INT qua;
  REF_INT nodes [27];
  int local_90;
  int local_8c;
  REF_INT new_tri;
  REF_INT tri;
  REF_DBL xyz [3];
  int local_68;
  REF_INT new_node;
  REF_INT node;
  REF_INT nhex;
  REF_INT npri;
  REF_INT npyr;
  REF_INT ntet;
  REF_INT nqua;
  REF_INT ntri;
  REF_INT nnode;
  FILE *file;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  ref_grid = (REF_GRID)filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  uVar1 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar1 == 0) {
    ref_node = *(REF_NODE *)ref_mpi_local;
    ref_cell = *(REF_CELL *)&ref_node->blank;
    _ntri = fopen((char *)ref_grid,"r");
    if (_ntri == (FILE *)0x0) {
      printf("unable to open %s\n",ref_grid);
    }
    if (_ntri == (FILE *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xf7
             ,"ref_import_ugrid","unable to open file");
      ref_grid_ptr_local._4_4_ = 2;
    }
    else {
      iVar2 = __isoc99_fscanf(_ntri,"%d",&nqua);
      if (iVar2 == 1) {
        iVar2 = __isoc99_fscanf(_ntri,"%d",&ntet);
        if (iVar2 == 1) {
          iVar2 = __isoc99_fscanf(_ntri,"%d",&npyr);
          if (iVar2 == 1) {
            iVar2 = __isoc99_fscanf(_ntri,"%d",&npri);
            if (iVar2 == 1) {
              iVar2 = __isoc99_fscanf(_ntri,"%d",&nhex);
              if (iVar2 == 1) {
                iVar2 = __isoc99_fscanf(_ntri,"%d",&node);
                if (iVar2 == 1) {
                  iVar2 = __isoc99_fscanf(_ntri,"%d",&new_node);
                  if (iVar2 == 1) {
                    if (0 < *(int *)(filename_local + 0x30)) {
                      ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid header");
                    }
                    for (local_68 = 0; local_68 < nqua; local_68 = local_68 + 1) {
                      uVar1 = ref_node_add((REF_NODE)ref_cell,(long)local_68,
                                           (REF_INT *)((long)xyz + 0x14));
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x104,"ref_import_ugrid",(ulong)uVar1,"new_node");
                        return uVar1;
                      }
                      if (local_68 != xyz[2]._4_4_) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x105,"ref_import_ugrid","node index");
                        return 1;
                      }
                      iVar2 = __isoc99_fscanf(_ntri,"%lf",&new_tri);
                      if (iVar2 != 1) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x106,"ref_import_ugrid","x");
                        return 1;
                      }
                      iVar2 = __isoc99_fscanf(_ntri,"%lf",xyz);
                      if (iVar2 != 1) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x107,"ref_import_ugrid","y");
                        return 1;
                      }
                      iVar2 = __isoc99_fscanf(_ntri,"%lf",xyz + 1);
                      if (iVar2 != 1) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                               ,0x108,"ref_import_ugrid","z");
                        return 1;
                      }
                      *(undefined8 *)(ref_cell->c2n + (long)(xyz[2]._4_4_ * 0xf) * 2) = _new_tri;
                      *(REF_DBL *)(ref_cell->c2n + (long)(xyz[2]._4_4_ * 0xf + 1) * 2) = xyz[0];
                      *(REF_DBL *)(ref_cell->c2n + (long)(xyz[2]._4_4_ * 0xf + 2) * 2) = xyz[1];
                    }
                    uVar1 = ref_node_initialize_n_global((REF_NODE)ref_cell,(long)nqua);
                    if (uVar1 == 0) {
                      if (0 < *(int *)(filename_local + 0x30)) {
                        ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid node");
                      }
                      file = (FILE *)ref_node->part;
                      nodes[1] = -1;
                      for (local_8c = 0; local_8c < ntet; local_8c = local_8c + 1) {
                        for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
                          iVar2 = __isoc99_fscanf(_ntri,"%d",&new_qua + local_68);
                          if (iVar2 != 1) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x116,"ref_import_ugrid","tri");
                            return 1;
                          }
                        }
                        new_qua = new_qua + -1;
                        qua = qua + -1;
                        nodes[0] = nodes[0] + -1;
                        uVar1 = ref_cell_add((REF_CELL)file,&new_qua,&local_90);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x11a,"ref_import_ugrid",(ulong)uVar1,"new tri");
                          return uVar1;
                        }
                        if (local_8c != local_90) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x11b,"ref_import_ugrid","tri index");
                          return 1;
                        }
                      }
                      file = *(FILE **)&ref_node->naux;
                      nodes[2] = -1;
                      for (face_id = 0; face_id < npyr; face_id = face_id + 1) {
                        for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
                          iVar2 = __isoc99_fscanf(_ntri,"%d",&new_qua + local_68);
                          if (iVar2 != 1) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x122,"ref_import_ugrid","qua");
                            return 1;
                          }
                        }
                        new_qua = new_qua + -1;
                        qua = qua + -1;
                        nodes[0] = nodes[0] + -1;
                        nodes[1] = nodes[1] + -1;
                        uVar1 = ref_cell_add((REF_CELL)file,&new_qua,&cell);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x127,"ref_import_ugrid",(ulong)uVar1,"new qua");
                          return uVar1;
                        }
                        if (face_id != cell) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x128,"ref_import_ugrid","qua index");
                          return 1;
                        }
                      }
                      file = (FILE *)ref_node->part;
                      for (local_8c = 0; local_8c < ntet; local_8c = local_8c + 1) {
                        iVar2 = __isoc99_fscanf(_ntri,"%d",&new_cell);
                        if (iVar2 != 1) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x12d,"ref_import_ugrid","tri id");
                          return 1;
                        }
                        *(REF_INT *)
                         (file->_IO_buf_base +
                         (long)(*(int *)&file->_IO_read_ptr * local_8c + 3) * 4) = new_cell;
                      }
                      file = *(FILE **)&ref_node->naux;
                      for (face_id = 0; face_id < npyr; face_id = face_id + 1) {
                        iVar2 = __isoc99_fscanf(_ntri,"%d",&new_cell);
                        if (iVar2 != 1) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x133,"ref_import_ugrid","qua id");
                          return 1;
                        }
                        *(REF_INT *)
                         (file->_IO_buf_base + (long)(*(int *)&file->_IO_read_ptr * face_id + 4) * 4
                         ) = new_cell;
                      }
                      if (0 < *(int *)(filename_local + 0x30)) {
                        ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid tri");
                      }
                      file = (FILE *)ref_node->ref_mpi;
                      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < npri;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        for (local_68 = 0; local_68 < 4; local_68 = local_68 + 1) {
                          iVar2 = __isoc99_fscanf(_ntri,"%d",&new_qua + local_68);
                          if (iVar2 != 1) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x13b,"ref_import_ugrid","tet");
                            return 1;
                          }
                        }
                        new_qua = new_qua + -1;
                        qua = qua + -1;
                        nodes[0] = nodes[0] + -1;
                        nodes[1] = nodes[1] + -1;
                        uVar1 = ref_cell_add((REF_CELL)file,&new_qua,&ref_private_macro_code_rss_1);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x140,"ref_import_ugrid",(ulong)uVar1,"new tet");
                          return uVar1;
                        }
                        if (ref_private_macro_code_rss != ref_private_macro_code_rss_1) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x141,"ref_import_ugrid","tet index");
                          return 1;
                        }
                      }
                      if (0 < *(int *)(filename_local + 0x30)) {
                        ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid tet");
                      }
                      file = *(FILE **)&ref_node->n_unused;
                      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < nhex;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        for (local_68 = 0; local_68 < 5; local_68 = local_68 + 1) {
                          iVar2 = __isoc99_fscanf(_ntri,"%d",&new_qua + local_68);
                          if (iVar2 != 1) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x148,"ref_import_ugrid","pyr");
                            return 1;
                          }
                        }
                        new_qua = new_qua + -1;
                        qua = qua + -1;
                        nodes[0] = nodes[0] + -1;
                        nodes[1] = nodes[1] + -1;
                        nodes[2] = nodes[2] + -1;
                        uVar1 = ref_cell_add((REF_CELL)file,&new_qua,&ref_private_macro_code_rss_1);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x14e,"ref_import_ugrid",(ulong)uVar1,"new pyr");
                          return uVar1;
                        }
                        if (ref_private_macro_code_rss != ref_private_macro_code_rss_1) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x14f,"ref_import_ugrid","pyr index");
                          return 1;
                        }
                      }
                      if (0 < *(int *)(filename_local + 0x30)) {
                        ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid pyr");
                      }
                      file = (FILE *)ref_node->unused_global;
                      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < node;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        for (local_68 = 0; local_68 < 6; local_68 = local_68 + 1) {
                          iVar2 = __isoc99_fscanf(_ntri,"%d",&new_qua + local_68);
                          if (iVar2 != 1) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x156,"ref_import_ugrid","pri");
                            return 1;
                          }
                        }
                        new_qua = new_qua + -1;
                        qua = qua + -1;
                        nodes[0] = nodes[0] + -1;
                        nodes[1] = nodes[1] + -1;
                        nodes[2] = nodes[2] + -1;
                        nodes[3] = nodes[3] + -1;
                        uVar1 = ref_cell_add((REF_CELL)file,&new_qua,&ref_private_macro_code_rss_1);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x15d,"ref_import_ugrid",(ulong)uVar1,"new pri");
                          return uVar1;
                        }
                        if (ref_private_macro_code_rss != ref_private_macro_code_rss_1) {
                          printf("cell %d %d\n",(ulong)(uint)ref_private_macro_code_rss,
                                 (ulong)(uint)ref_private_macro_code_rss_1);
                        }
                        if (ref_private_macro_code_rss != ref_private_macro_code_rss_1) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x163,"ref_import_ugrid","pri index");
                          return 1;
                        }
                      }
                      if (0 < *(int *)(filename_local + 0x30)) {
                        ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid pri");
                      }
                      file = (FILE *)ref_node->old_n_global;
                      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < new_node;
                          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
                        for (local_68 = 0; local_68 < 8; local_68 = local_68 + 1) {
                          iVar2 = __isoc99_fscanf(_ntri,"%d",&new_qua + local_68);
                          if (iVar2 != 1) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                   ,0x16a,"ref_import_ugrid","hex");
                            return 1;
                          }
                        }
                        new_qua = new_qua + -1;
                        qua = qua + -1;
                        nodes[0] = nodes[0] + -1;
                        nodes[1] = nodes[1] + -1;
                        nodes[2] = nodes[2] + -1;
                        nodes[3] = nodes[3] + -1;
                        nodes[4] = nodes[4] + -1;
                        nodes[5] = nodes[5] + -1;
                        uVar1 = ref_cell_add((REF_CELL)file,&new_qua,&ref_private_macro_code_rss_1);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x173,"ref_import_ugrid",(ulong)uVar1,"new hex");
                          return uVar1;
                        }
                        if (ref_private_macro_code_rss != ref_private_macro_code_rss_1) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                                 ,0x174,"ref_import_ugrid","hex index");
                          return 1;
                        }
                      }
                      if (0 < *(int *)(filename_local + 0x30)) {
                        ref_mpi_stopwatch_stop((REF_MPI)filename_local,"ugrid hex");
                      }
                      fclose(_ntri);
                      ref_grid_ptr_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x10e,"ref_import_ugrid",(ulong)uVar1,"init glob");
                      ref_grid_ptr_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0xff,"ref_import_ugrid","nhex");
                    ref_grid_ptr_local._4_4_ = 1;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                         ,0xfe,"ref_import_ugrid","npri");
                  ref_grid_ptr_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0xfd,"ref_import_ugrid","npyr");
                ref_grid_ptr_local._4_4_ = 1;
              }
            }
            else {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0xfc,"ref_import_ugrid","ntet");
              ref_grid_ptr_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0xfb,"ref_import_ugrid","nqua");
            ref_grid_ptr_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0xfa,"ref_import_ugrid","ntri");
          ref_grid_ptr_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0xf9,"ref_import_ugrid","nnode");
        ref_grid_ptr_local._4_4_ = 1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0xf1,
           "ref_import_ugrid",(ulong)uVar1,"create grid");
    ref_grid_ptr_local._4_4_ = uVar1;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_ugrid(REF_GRID *ref_grid_ptr,
                                           REF_MPI ref_mpi,
                                           const char *filename) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  FILE *file;
  REF_INT nnode, ntri, nqua, ntet, npyr, npri, nhex;
  REF_INT node, new_node;
  REF_DBL xyz[3];
  REF_INT tri, new_tri;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua, new_qua;
  REF_INT face_id;
  REF_INT cell, new_cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  RES(1, fscanf(file, "%d", &nnode), "nnode");
  RES(1, fscanf(file, "%d", &ntri), "ntri");
  RES(1, fscanf(file, "%d", &nqua), "nqua");
  RES(1, fscanf(file, "%d", &ntet), "ntet");
  RES(1, fscanf(file, "%d", &npyr), "npyr");
  RES(1, fscanf(file, "%d", &npri), "npri");
  RES(1, fscanf(file, "%d", &nhex), "nhex");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid header");

  for (node = 0; node < nnode; node++) {
    RSS(ref_node_add(ref_node, node, &new_node), "new_node");
    RES(node, new_node, "node index");
    RES(1, fscanf(file, "%lf", &(xyz[0])), "x");
    RES(1, fscanf(file, "%lf", &(xyz[1])), "y");
    RES(1, fscanf(file, "%lf", &(xyz[2])), "z");
    ref_node_xyz(ref_node, 0, new_node) = xyz[0];
    ref_node_xyz(ref_node, 1, new_node) = xyz[1];
    ref_node_xyz(ref_node, 2, new_node) = xyz[2];
  }

  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");
  if (0 < ref_mpi_timing(ref_mpi))
    ref_mpi_stopwatch_stop(ref_mpi, "ugrid node");

  ref_cell = ref_grid_tri(ref_grid);
  nodes[3] = REF_EMPTY;
  for (tri = 0; tri < ntri; tri++) {
    for (node = 0; node < 3; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_tri), "new tri");
    RES(tri, new_tri, "tri index");
  }

  ref_cell = ref_grid_qua(ref_grid);
  nodes[4] = REF_EMPTY;
  for (qua = 0; qua < nqua; qua++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "qua");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_qua), "new qua");
    RES(qua, new_qua, "qua index");
  }

  ref_cell = ref_grid_tri(ref_grid);
  for (tri = 0; tri < ntri; tri++) {
    RES(1, fscanf(file, "%d", &face_id), "tri id");
    ref_cell_c2n(ref_cell, 3, tri) = face_id;
  }

  ref_cell = ref_grid_qua(ref_grid);
  for (qua = 0; qua < nqua; qua++) {
    RES(1, fscanf(file, "%d", &face_id), "qua id");
    ref_cell_c2n(ref_cell, 4, qua) = face_id;
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tri");

  ref_cell = ref_grid_tet(ref_grid);
  for (cell = 0; cell < ntet; cell++) {
    for (node = 0; node < 4; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "tet");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new tet");
    RES(cell, new_cell, "tet index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid tet");

  ref_cell = ref_grid_pyr(ref_grid);
  for (cell = 0; cell < npyr; cell++) {
    for (node = 0; node < 5; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "pyr");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    nodes[4]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new pyr");
    RES(cell, new_cell, "pyr index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pyr");

  ref_cell = ref_grid_pri(ref_grid);
  for (cell = 0; cell < npri; cell++) {
    for (node = 0; node < 6; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "pri");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    nodes[4]--;
    nodes[5]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new pri");

    if (cell != new_cell) {
      printf("cell %d %d\n", cell, new_cell);
    }

    RES(cell, new_cell, "pri index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid pri");

  ref_cell = ref_grid_hex(ref_grid);
  for (cell = 0; cell < nhex; cell++) {
    for (node = 0; node < 8; node++)
      RES(1, fscanf(file, "%d", &(nodes[node])), "hex");
    nodes[0]--;
    nodes[1]--;
    nodes[2]--;
    nodes[3]--;
    nodes[4]--;
    nodes[5]--;
    nodes[6]--;
    nodes[7]--;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "new hex");
    RES(cell, new_cell, "hex index");
  }
  if (0 < ref_mpi_timing(ref_mpi)) ref_mpi_stopwatch_stop(ref_mpi, "ugrid hex");

  fclose(file);

  return REF_SUCCESS;
}